

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O1

void MARGINAL::make_marginal<true>(data *sm,example *ec)

{
  double dVar1;
  byte bVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this;
  features *pfVar7;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  int iVar8;
  float *pfVar9;
  ostream *poVar10;
  __node_base_ptr p_Var11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  uint64_t *puVar14;
  long lVar15;
  ulong uVar16;
  float *pfVar17;
  features *pfVar18;
  _Hash_node_base **pp_Var19;
  features *pfVar20;
  __node_base_ptr p_Var21;
  features *pfVar22;
  ulong i;
  ulong *puVar23;
  byte bVar24;
  float v;
  float extraout_XMM0_Da;
  uint64_t key;
  _Hash_node_base *local_110;
  float local_108;
  float local_104;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_100;
  byte *local_f8;
  features *local_f0;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_e8;
  features *local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 uStack_c8;
  undefined4 local_c4;
  features *local_c0;
  features *local_b8;
  vw *local_b0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a8;
  uint64_t local_a0;
  _Hash_node_base *local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  float local_38;
  
  bVar24 = 0;
  local_b0 = sm->all;
  puVar14 = &(local_b0->weights).dense_weights._weight_mask;
  if ((local_b0->weights).sparse != false) {
    puVar14 = &(local_b0->weights).sparse_weights._weight_mask;
  }
  local_a0 = *puVar14;
  local_108 = (ec->l).simple.label;
  sm->average_pred = 0.0;
  sm->net_weight = 0.0;
  sm->net_feature_weight = 0.0;
  sm->alg_loss = 0.0;
  local_f8 = (ec->super_example_predict).indices._begin;
  if (local_f8 != (ec->super_example_predict).indices._end) {
    local_b8 = (ec->super_example_predict).feature_space;
    local_c0 = sm->temp;
    local_e8 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&sm->marginals;
    local_100 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&sm->expert_state;
    do {
      pfVar7 = local_c0;
      bVar2 = *local_f8;
      if (sm->id_features[bVar2] == true) {
        pfVar22 = local_c0 + bVar2;
        pfVar18 = pfVar22;
        pp_Var19 = &local_98;
        for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
          *pp_Var19 = (_Hash_node_base *)(pfVar18->values)._begin;
          pfVar18 = (features *)((long)pfVar18 + (ulong)bVar24 * -0x10 + 8);
          pp_Var19 = pp_Var19 + (ulong)bVar24 * -2 + 1;
        }
        pfVar18 = local_b8 + bVar2;
        pfVar20 = pfVar22;
        for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pfVar20->values)._begin = (pfVar18->values)._begin;
          pfVar18 = (features *)((long)pfVar18 + (ulong)bVar24 * -0x10 + 8);
          pfVar20 = (features *)((long)pfVar20 + (ulong)bVar24 * -0x10 + 8);
        }
        local_c0[bVar2].sum_feat_sq = local_b8[bVar2].sum_feat_sq;
        pp_Var19 = &local_98;
        pfVar18 = local_b8 + bVar2;
        for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pfVar18->values)._begin = (float *)*pp_Var19;
          pp_Var19 = pp_Var19 + (ulong)bVar24 * -2 + 1;
          pfVar18 = (features *)((long)pfVar18 + (ulong)bVar24 * -0x10 + 8);
        }
        local_b8[bVar2].sum_feat_sq = local_38;
        local_f0 = local_b8 + *local_f8;
        features::clear(local_f0);
        pfVar17 = pfVar7[bVar2].values._begin;
        pfVar9 = pfVar7[bVar2].values._end;
        if (pfVar17 != pfVar9) {
          puVar23 = (pfVar22->indicies)._begin;
          local_a8 = &local_f0->space_names;
          local_e0 = pfVar22;
          do {
            if (pfVar17 + 1 == pfVar9) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"warning: id feature namespace has ",0x22);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," features. Should be a multiple of 2",0x24);
              std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              iVar8 = 5;
            }
            else if ((((*pfVar17 != 1.0) || (NAN(*pfVar17))) || (pfVar17[1] != 1.0)) ||
                    (NAN(pfVar17[1]))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"warning: bad id features, must have value 1.",0x2c);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
              std::ostream::put(-0x28);
              std::ostream::flush();
              iVar8 = 7;
            }
            else {
              i = *puVar23 & local_a0;
              local_110 = (_Hash_node_base *)
                          ((puVar23[1] & local_a0) + (ec->super_example_predict).ft_offset);
              uVar3 = (sm->marginals)._M_h._M_bucket_count;
              uVar16 = (ulong)local_110 % uVar3;
              p_Var4 = (sm->marginals)._M_h._M_buckets[uVar16];
              p_Var11 = (__node_base_ptr)0x0;
              if ((p_Var4 != (__node_base_ptr)0x0) &&
                 (p_Var11 = p_Var4, p_Var21 = p_Var4->_M_nxt, local_110 != p_Var4->_M_nxt[1]._M_nxt)
                 ) {
                while (p_Var5 = p_Var21->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
                  p_Var11 = (__node_base_ptr)0x0;
                  if (((ulong)p_Var5[1]._M_nxt % uVar3 != uVar16) ||
                     (p_Var11 = p_Var21, p_Var21 = p_Var5, local_110 == p_Var5[1]._M_nxt))
                  goto LAB_0023a097;
                }
                p_Var11 = (__node_base_ptr)0x0;
              }
LAB_0023a097:
              if ((p_Var11 == (__node_base_ptr)0x0) || (p_Var11->_M_nxt == (_Hash_node_base *)0x0))
              {
                local_90._0_4_ = sm->initial_numerator;
                local_90._4_4_ = sm->initial_denominator;
                local_98 = local_110;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,std::pair<float,float>>>(local_e8,&local_98);
                if (sm->compete == true) {
                  local_d0 = 0x3f800000;
                  local_d8 = 0;
                  local_c4 = 0x3f800000;
                  local_cc = 0;
                  uStack_c8 = 0;
                  local_98 = local_110;
                  local_80 = 0x3f80000000000000;
                  local_90 = 0;
                  local_88 = 0x3f800000;
                  local_84 = 0;
                  std::
                  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                            (local_100,&local_98);
                }
              }
              this_00 = local_e8;
              pmVar12 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_e8,(key_type *)&local_110);
              dVar1 = pmVar12->first;
              pmVar12 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)this_00,(key_type *)&local_110);
              pfVar7 = local_f0;
              v = (float)(dVar1 / pmVar12->second);
              features::push_back(local_f0,v,i);
              psVar6 = (local_e0->space_names)._begin;
              if (psVar6 != (local_e0->space_names)._end) {
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(local_a8,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)psVar6 +
                                        ((long)(pfVar7->values)._end - (long)(pfVar7->values)._begin
                                        ) * 8 + -0x20));
              }
              this = local_100;
              if (sm->compete == true) {
                pmVar13 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)local_100,(key_type *)&local_110);
                local_104 = (pmVar13->first).weight;
                sm->average_pred = local_104 * v + sm->average_pred;
                sm->net_weight = sm->net_weight + local_104;
                pmVar13 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)this,(key_type *)&local_110);
                sm->net_feature_weight = (pmVar13->second).weight + sm->net_feature_weight;
                (*local_b0->loss->_vptr_loss_function[1])(v,local_108,local_b0->loss,local_b0->sd);
                sm->alg_loss = extraout_XMM0_Da * local_104 + sm->alg_loss;
              }
              iVar8 = 0;
              pfVar22 = local_e0;
            }
            if ((iVar8 != 7) && (iVar8 != 0)) break;
            pfVar17 = pfVar17 + 2;
            puVar23 = puVar23 + 2;
            pfVar9 = (pfVar22->values)._end;
          } while (pfVar17 != pfVar9);
        }
      }
      local_f8 = local_f8 + 1;
    } while (local_f8 != (ec->super_example_predict).indices._end);
  }
  return;
}

Assistant:

void make_marginal(data& sm, example& ec)
{
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  vw& all = *sm.all;
  sm.alg_loss = 0.;
  sm.net_weight = 0.;
  sm.net_feature_weight = 0.;
  sm.average_pred = 0.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
    {
      std::swap(sm.temp[n], *i);
      features& f = *i;
      f.clear();
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        float first_value = j.value();
        uint64_t first_index = j.index() & mask;
        if (++j == sm.temp[n].end())
        {
          cout << "warning: id feature namespace has " << sm.temp[n].size() << " features. Should be a multiple of 2"
               << endl;
          break;
        }
        float second_value = j.value();
        uint64_t second_index = j.index() & mask;
        if (first_value != 1. || second_value != 1.)
        {
          cout << "warning: bad id features, must have value 1." << endl;
          continue;
        }
        uint64_t key = second_index + ec.ft_offset;
        if (sm.marginals.find(key) == sm.marginals.end())  // need to initialize things.
        {
          sm.marginals.insert(make_pair(key, make_pair(sm.initial_numerator, sm.initial_denominator)));
          if (sm.compete)
          {
            expert e = {0, 0, 1.};
            sm.expert_state.insert(make_pair(key, make_pair(e, e)));
          }
        }
        float marginal_pred = (float)(sm.marginals[key].first / sm.marginals[key].second);
        f.push_back(marginal_pred, first_index);
        if (!sm.temp[n].space_names.empty())
          f.space_names.push_back(sm.temp[n].space_names[2 * (f.size() - 1)]);

        if (sm.compete)  // compute the prediction from the marginals using the weights
        {
          float weight = sm.expert_state[key].first.weight;
          sm.average_pred += weight * marginal_pred;
          sm.net_weight += weight;
          sm.net_feature_weight += sm.expert_state[key].second.weight;
          if (is_learn)
            sm.alg_loss += weight * all.loss->getLoss(all.sd, marginal_pred, label);
        }
      }
    }
  }
}